

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

SP pbrt::Scene::loadFrom(istream *inStream)

{
  bool bVar1;
  runtime_error *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  SP SVar2;
  BinaryReader binary;
  SP *scene;
  element_type *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  shared_ptr<pbrt::Entity> *in_stack_ffffffffffffffa8;
  
  this_00 = in_RDI;
  BinaryReader::BinaryReader
            ((BinaryReader *)binary.currentEntityOffset,
             (istream *)
             binary.currentEntityData.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  bVar1 = std::
          vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>::
          empty((vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
                 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"error in Scene::load - no entities");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>::back
            ((vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
              *)this_00);
  std::dynamic_pointer_cast<pbrt::Scene,pbrt::Entity>(in_stack_ffffffffffffffa8);
  BinaryReader::~BinaryReader((BinaryReader *)this_00);
  SVar2.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar2.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar2.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Scene::SP Scene::loadFrom(std::istream &inStream)
  {
    BinaryReader binary(inStream);
    if (binary.readEntities.empty())
      throw std::runtime_error("error in Scene::load - no entities");
    Scene::SP scene = std::dynamic_pointer_cast<Scene>(binary.readEntities.back());
    assert(scene);
    return scene;
  }